

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

ptr<log_entry> __thiscall nuraft::inmem_log_store::entry_at(inmem_log_store *this,ulong index)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar5;
  long lVar6;
  bool bVar7;
  ptr<log_entry> pVar8;
  ptr<log_entry> src;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(index + 0x38));
  if (iVar1 == 0) {
    lVar6 = index + 0x10;
    lVar2 = lVar6;
    for (lVar5 = *(long *)(index + 0x18); lVar5 != 0;
        lVar5 = *(long *)(lVar5 + 0x10 + (ulong)bVar7 * 8)) {
      bVar7 = *(ulong *)(lVar5 + 0x20) < in_RDX;
      if (!bVar7) {
        lVar2 = lVar5;
      }
    }
    lVar5 = lVar6;
    if ((lVar2 != lVar6) && (lVar5 = lVar2, in_RDX < *(ulong *)(lVar2 + 0x20))) {
      lVar5 = lVar6;
    }
    lVar2 = *(long *)(index + 0x18);
    lVar3 = lVar6;
    if (lVar5 == lVar6) {
      while (lVar5 = lVar2, lVar5 != 0) {
        lVar3 = lVar5;
        lVar2 = *(long *)(lVar5 + 0x10);
      }
      lVar5 = lVar6;
      if ((lVar3 != lVar6) && (*(long *)(lVar3 + 0x20) == 0)) {
        lVar5 = lVar3;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_30,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar5 + 0x30));
    pthread_mutex_unlock((pthread_mutex_t *)(index + 0x38));
    pVar8 = make_clone((ptr<log_entry> *)this);
    _Var4 = pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
      _Var4._M_pi = extraout_RDX;
    }
    pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<log_entry>)pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ptr<log_entry> inmem_log_store::entry_at(ulong index) {
    ptr<log_entry> src = nullptr;
    {   std::lock_guard<std::mutex> l(logs_lock_);
        auto entry = logs_.find(index);
        if (entry == logs_.end()) {
            entry = logs_.find(0);
        }
        src = entry->second;
    }
    return make_clone(src);
}